

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

bool __thiscall smf::MidiFile::readSmf(MidiFile *this,istream *input)

{
  uint uVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  MidiEventList *pMVar8;
  undefined1 uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uchar runningCommand;
  string filename;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  MidiEvent event;
  char local_b2 [2];
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  ulong local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  MidiEvent local_68;
  
  this->m_rwstatus = true;
  std::__cxx11::string::string
            ((string *)&local_b0,(this->m_readFileName)._M_dataplus._M_p,(allocator *)&local_68);
  iVar5 = std::istream::get();
  if (iVar5 == 0x4d) {
    iVar5 = std::istream::get();
    if (iVar5 == 0x54) {
      iVar5 = std::istream::get();
      if (iVar5 == 0x68) {
        iVar5 = std::istream::get();
        if (iVar5 == 100) {
          uVar7 = readLittleEndian4Bytes(input);
          if (uVar7 == 6) {
            uVar3 = readLittleEndian2Bytes(input);
            if (uVar3 == 0) {
              bVar2 = true;
            }
            else {
              if (uVar3 != 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Error: cannot handle a type-",0x1c);
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," MIDI file",10);
                std::endl<char,std::char_traits<char>>(poVar6);
                goto LAB_00115fe5;
              }
              bVar2 = false;
            }
            uVar3 = readLittleEndian2Bytes(input);
            if (!bVar2 || uVar3 == 1) {
              clear(this);
              pMVar8 = *(this->m_events).
                        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (pMVar8 != (MidiEventList *)0x0) {
                MidiEventList::~MidiEventList(pMVar8);
                operator_delete(pMVar8);
              }
              local_90 = (ulong)uVar3;
              std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                        (&this->m_events,local_90);
              if (uVar3 != 0) {
                uVar12 = 0;
                do {
                  pMVar8 = (MidiEventList *)operator_new(0x18);
                  MidiEventList::MidiEventList(pMVar8);
                  (this->m_events).
                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12] = pMVar8;
                  MidiEventList::reserve
                            ((this->m_events).
                             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar12],10000);
                  MidiEventList::clear
                            ((this->m_events).
                             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar12]);
                  uVar12 = uVar12 + 1;
                } while (local_90 != uVar12);
              }
              uVar4 = readLittleEndian2Bytes(input);
              uVar11 = (uint)uVar4;
              if ((short)uVar4 < 0) {
                uVar1 = (uVar4 >> 8) + 0x1e;
                if (((byte)uVar1 < 7) && ((99U >> (uVar1 & 0x1f) & 1) != 0)) {
                  iVar5 = *(int *)(&DAT_001293c8 + (ulong)(uVar1 & 0xff) * 4);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Warning: unknown FPS: ",0x16);
                  iVar5 = 0x100 - (uint)(uVar4 >> 8);
                  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar5);
                  std::endl<char,std::char_traits<char>>(poVar6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Using non-standard FPS: ",0x18);
                  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar5);
                  std::endl<char,std::char_traits<char>>(poVar6);
                }
                uVar11 = (uVar11 & 0xff) * iVar5;
              }
              this->m_ticksPerQuarterNote = uVar11;
              MidiEvent::MidiEvent(&local_68);
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (uVar3 != 0) {
                uVar12 = 0;
                do {
                  local_b2[1] = 0;
                  iVar5 = std::istream::get();
                  if (iVar5 != 0x4d) {
                    if (iVar5 == -1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"In file ",8);
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b0,local_a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,": unexpected end of file.",0x19);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "Expecting \'M\' at first byte in track, but found nothing.",0x38);
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"File ",5);
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b0,local_a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6," is not a MIDI file",0x13);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "Expecting \'M\' at first byte in track but got \'",0x2e);
                      local_b2[0] = (char)iVar5;
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b2,1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
                      std::endl<char,std::char_traits<char>>(poVar6);
                    }
LAB_00116721:
                    this->m_rwstatus = false;
                    uVar9 = 0;
                    goto LAB_00116727;
                  }
                  iVar5 = std::istream::get();
                  if (iVar5 != 0x54) {
                    if (iVar5 == -1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"In file ",8);
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b0,local_a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,": unexpected end of file.",0x19);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "Expecting \'T\' at second byte in track, but found nothing.",0x39)
                      ;
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"File ",5);
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b0,local_a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6," is not a MIDI file",0x13);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "Expecting \'T\' at second byte in track but got \'",0x2f);
                      local_b2[0] = (char)iVar5;
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b2,1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
                      std::endl<char,std::char_traits<char>>(poVar6);
                    }
                    goto LAB_00116721;
                  }
                  iVar5 = std::istream::get();
                  if (iVar5 != 0x72) {
                    if (iVar5 == -1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"In file ",8);
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b0,local_a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,": unexpected end of file.",0x19);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "Expecting \'r\' at third byte in track, but found nothing.",0x38);
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"File ",5);
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b0,local_a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6," is not a MIDI file",0x13);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "Expecting \'r\' at third byte in track but got \'",0x2e);
                      local_b2[0] = (char)iVar5;
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b2,1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
                      std::endl<char,std::char_traits<char>>(poVar6);
                    }
                    goto LAB_00116721;
                  }
                  iVar5 = std::istream::get();
                  if (iVar5 != 0x6b) {
                    if (iVar5 == -1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"In file ",8);
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b0,local_a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,": unexpected end of file.",0x19);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "Expecting \'k\' at fourth byte in track, but found nothing.",0x39)
                      ;
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"File ",5);
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b0,local_a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6," is not a MIDI file",0x13);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "Expecting \'k\' at fourth byte in track but got \'",0x2f);
                      local_b2[0] = (char)iVar5;
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,local_b2,1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
                      std::endl<char,std::char_traits<char>>(poVar6);
                    }
                    goto LAB_00116721;
                  }
                  uVar7 = readLittleEndian4Bytes(input);
                  MidiEventList::reserve
                            ((this->m_events).
                             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar12],
                             (int)(((uint)(uVar7 >> 0x1f) & 1) + (int)uVar7) >> 1);
                  MidiEventList::clear
                            ((this->m_events).
                             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar12]);
                  lVar10 = 0;
                  while (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
                    uVar7 = readVLValue(this,input);
                    iVar5 = extractMidiData(this,input,&local_88,(uchar *)(local_b2 + 1));
                    if (iVar5 == 0) goto LAB_00116721;
                    MidiMessage::setMessage(&local_68.super_MidiMessage,&local_88);
                    lVar10 = uVar7 + (long)(int)lVar10;
                    local_68.tick = (int)lVar10;
                    local_68.track = (int)uVar12;
                    if ((*local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0xff) &&
                       (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[1] == '/')) {
                      MidiEventList::push_back
                                ((this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar12],&local_68);
                      break;
                    }
                    MidiEventList::push_back
                              ((this->m_events).
                               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar12],&local_68);
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != local_90);
              }
              this->m_theTimeState = 1;
              markSequence(this);
              uVar9 = this->m_rwstatus;
LAB_00116727:
              if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              MidiEvent::~MidiEvent(&local_68);
              goto LAB_00115feb;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error: Type 0 MIDI file can only contain one track",
                       0x32);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Instead track count is: ",0x18);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_b0,local_a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," is not a MIDI 1.0 Standard MIDI file.",0x26);
            std::endl<char,std::char_traits<char>>(poVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"The header size is ",0x13);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," bytes.",7);
            std::endl<char,std::char_traits<char>>(poVar6);
          }
        }
        else if (iVar5 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_b0,local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,": unexpected end of file.",0x19);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Expecting \'d\' at fourth byte, but found nothing.",0x30
                    );
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_b0,local_a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not a MIDI file",0x13);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Expecting \'d\' at fourth byte but got \'",0x26);
          local_68.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = (undefined1)iVar5;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)&local_68,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
      else if (iVar5 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_b0,local_a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": unexpected end of file.",0x19);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Expecting \'h\' at third byte, but found nothing.",0x2f);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_b0,local_a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not a MIDI file",0x13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Expecting \'h\' at third byte but got \'",0x25);
        local_68.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = (undefined1)iVar5;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)&local_68,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
    }
    else if (iVar5 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_b0,local_a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": unexpected end of file.",0x19);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Expecting \'T\' at second byte, but found nothing.",0x30);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_b0,local_a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not a MIDI file",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Expecting \'T\' at second byte but got \'",0x26);
      local_68.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = (undefined1)iVar5;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_68,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  else if (iVar5 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_b0,local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": unexpected end of file.",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Expecting \'M\' at first byte, but found nothing.",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_b0,local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not a MIDI file",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Expecting \'M\' at first byte but got \'",0x25);
    local_68.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (undefined1)iVar5;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_68,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
LAB_00115fe5:
  this->m_rwstatus = false;
  uVar9 = 0;
LAB_00115feb:
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return (bool)uVar9;
}

Assistant:

bool MidiFile::readSmf(std::istream& input) {
	m_rwstatus = true;

	std::string filename = getFilename();

	int    character;
	// uchar  buffer[123456] = {0};
	ulong  longdata;
	ushort shortdata;

	// Read the MIDI header (4 bytes of ID, 4 byte data size,
	// anticipated 6 bytes of data.

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'M' at first byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'M') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'M' at first byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'T' at second byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'T') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'T' at second byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'h' at third byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'h') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'h' at third byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'd' at fourth byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'd') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'd' at fourth byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// read header size (allow larger header size?)
	longdata = readLittleEndian4Bytes(input);
	if (longdata != 6) {
		std::cerr << "File " << filename
		     << " is not a MIDI 1.0 Standard MIDI file." << std::endl;
		std::cerr << "The header size is " << longdata << " bytes." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #1: format type
	int type;
	shortdata = readLittleEndian2Bytes(input);
	switch (shortdata) {
		case 0:
			type = 0;
			break;
		case 1:
			type = 1;
			break;
		case 2:
			// Type-2 MIDI files should probably be allowed as well,
			// but I have never seen one in the wild to test with.
		default:
			std::cerr << "Error: cannot handle a type-" << shortdata
			     << " MIDI file" << std::endl;
			m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #2: track count
	int tracks;
	shortdata = readLittleEndian2Bytes(input);
	if (type == 0 && shortdata != 1) {
		std::cerr << "Error: Type 0 MIDI file can only contain one track" << std::endl;
		std::cerr << "Instead track count is: " << shortdata << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else {
		tracks = shortdata;
	}
	clear();
	if (m_events[0] != NULL) {
		delete m_events[0];
	}
	m_events.resize(tracks);
	for (int z=0; z<tracks; z++) {
		m_events[z] = new MidiEventList;
		m_events[z]->reserve(10000);   // Initialize with 10,000 event storage.
		m_events[z]->clear();
	}

	// Header parameter #3: Ticks per quarter note
	shortdata = readLittleEndian2Bytes(input);
	if (shortdata >= 0x8000) {
		int framespersecond = 255 - ((shortdata >> 8) & 0x00ff) + 1;
		int subframes       = shortdata & 0x00ff;
		switch (framespersecond) {
			case 25:  framespersecond = 25; break;
			case 24:  framespersecond = 24; break;
			case 29:  framespersecond = 29; break;  // really 29.97 for color television
			case 30:  framespersecond = 30; break;
			default:
					std::cerr << "Warning: unknown FPS: " << framespersecond << std::endl;
					std::cerr << "Using non-standard FPS: " << framespersecond << std::endl;
		}
		m_ticksPerQuarterNote = framespersecond * subframes;

		// std::cerr << "SMPTE ticks: " << m_ticksPerQuarterNote << " ticks/sec" << std::endl;
		// std::cerr << "SMPTE frames per second: " << framespersecond << std::endl;
		// std::cerr << "SMPTE subframes per frame: " << subframes << std::endl;
	}  else {
		m_ticksPerQuarterNote = shortdata;
	}


	//////////////////////////////////////////////////
	//
	// now read individual tracks:
	//

	uchar runningCommand;
	MidiEvent event;
	std::vector<uchar> bytes;
	int xstatus;

	for (int i=0; i<tracks; i++) {
		runningCommand = 0;

		// std::cout << "\nReading Track: " << i + 1 << flush;

		// read track header...

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'M' at first byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'M') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'M' at first byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'T' at second byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'T') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'T' at second byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'r' at third byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'r') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'r' at third byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'k') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		// Now read track chunk size and throw it away because it is
		// not really necessary since the track MUST end with an
		// end of track meta event, and many MIDI files found in the wild
		// do not correctly give the track size.
		longdata = readLittleEndian4Bytes(input);

		// Set the size of the track allocation so that it might
		// approximately fit the data.
		m_events[i]->reserve((int)longdata/2);
		m_events[i]->clear();

		// Read MIDI events in the track, which are pairs of VLV values
		// and then the bytes for the MIDI message.  Running status messages
		// will be filled in with their implicit command byte.
		// The timestamps are converted from delta ticks to absolute ticks,
		// with the absticks variable accumulating the VLV tick values.
		int absticks = 0;
		while (!input.eof()) {
			longdata = readVLValue(input);
			absticks += longdata;
			xstatus = extractMidiData(input, bytes, runningCommand);
			if (xstatus == 0) {
				m_rwstatus = false; return m_rwstatus;
			}
			event.setMessage(bytes);
			event.tick = absticks;
			event.track = i;

			if (bytes[0] == 0xff && bytes[1] == 0x2f) {
				// end-of-track message
				// comment out the following line if you don't want to see the
				// end of track message (which is always required, and will added
				// automatically when a MIDI is written, so it is not necessary.
				m_events[i]->push_back(event);
				break;
			}
			m_events[i]->push_back(event);
		}
	}

	m_theTimeState = TIME_STATE_ABSOLUTE;

	// The original order of the MIDI events is marked with an enumeration which
	// allows for reconstruction of the order when merging/splitting tracks to/from
	// a type-0 configuration.
	markSequence();

	return m_rwstatus;
}